

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::BackupWallet(CWallet *this,string *strDest)

{
  Chain *pCVar1;
  WalletDatabase *pWVar2;
  int iVar3;
  long in_FS_OFFSET;
  CBlockLocator loc;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock63;
  CBlockLocator local_a8;
  WalletBatch local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_chain != (Chain *)0x0) {
    local_a8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_30._M_device = &(this->cs_wallet).super_recursive_mutex;
    local_30._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_30);
    pCVar1 = this->m_chain;
    if (pCVar1 == (Chain *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88.m_batch._M_t.
    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
    super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl =
         (__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
          )(__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0;
    local_88.m_database = (WalletDatabase *)0x0;
    local_58 = (undefined1 *)&local_a8;
    (**(code **)(*(long *)pCVar1 + 0x50))(pCVar1,&this->m_last_block_processed);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
    if (local_a8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_a8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pWVar2 = (this->m_database)._M_t.
               super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
               ._M_t.
               super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
               .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      if (pWVar2 == (WalletDatabase *)0x0) goto LAB_00169bd0;
      (*pWVar2->_vptr_WalletDatabase[0xe])(&local_88,pWVar2,1);
      local_88.m_database = pWVar2;
      WalletBatch::WriteBestBlock(&local_88,&local_a8);
      if (local_88.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0)
      {
        (*(*(_func_int ***)
            local_88.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
      }
    }
    if (local_a8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  pWVar2 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar2 != (WalletDatabase *)0x0) {
    iVar3 = (*pWVar2->_vptr_WalletDatabase[6])(pWVar2,strDest);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
      __stack_chk_fail();
    }
    return SUB41(iVar3,0);
  }
LAB_00169bd0:
  __assert_fail("static_cast<bool>(m_database)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
}

Assistant:

bool CWallet::BackupWallet(const std::string& strDest) const
{
    if (m_chain) {
        CBlockLocator loc;
        WITH_LOCK(cs_wallet, chain().findBlock(m_last_block_processed, FoundBlock().locator(loc)));
        if (!loc.IsNull()) {
            WalletBatch batch(GetDatabase());
            batch.WriteBestBlock(loc);
        }
    }
    return GetDatabase().Backup(strDest);
}